

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O3

void __thiscall
test_matrix_dense_scalar_matrix_division_assignment_Test::TestBody
          (test_matrix_dense_scalar_matrix_division_assignment_Test *this)

{
  void *pvVar1;
  double *pdVar2;
  pointer pVVar3;
  long lVar4;
  Vector_Dense<double,_0UL> *element;
  double *element_1;
  undefined8 *puVar5;
  double *pdVar6;
  Vector_Dense<double,_0UL> *pVVar7;
  char *pcVar8;
  Vector_Dense<double,_0UL> *this_00;
  long lVar9;
  byte bVar10;
  Matrix_Dense<double,_0UL,_0UL> dynamic_matrix;
  AssertHelper local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined1 local_168 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_160;
  double local_158;
  Vector_Dense<double,_3UL> local_150;
  Vector_Dense<double,_3UL> local_138;
  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  local_120;
  pointer local_108;
  pointer local_100;
  pointer local_f8;
  pointer local_f0;
  pointer local_e8;
  pointer local_e0;
  pointer local_d8 [3];
  Vector_Dense<double,_0UL> local_c0;
  Vector_Dense<double,_0UL> local_a8;
  Vector_Dense<double,_0UL> local_90;
  initializer_list<Disa::Vector_Dense<double,_0UL>_> local_78;
  undefined8 local_68;
  initializer_list<double> local_58;
  initializer_list<double> local_48;
  initializer_list<double> local_38;
  
  bVar10 = 0;
  local_38._M_array = (iterator)local_168;
  local_168 = (undefined1  [8])0x3ff0000000000000;
  pbStack_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0x4000000000000000;
  local_158 = 3.0;
  local_38._M_len = 3;
  this_00 = &local_c0;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(this_00,&local_38);
  local_188._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4010000000000000
  ;
  uStack_180 = 0x4014000000000000;
  local_178 = 0x4018000000000000;
  local_48._M_len = 3;
  local_48._M_array = (iterator)&local_188;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(&local_a8,&local_48);
  local_1a8.data_ = (AssertHelperData *)0x401c000000000000;
  uStack_1a0 = 0x4020000000000000;
  local_198 = 0x4022000000000000;
  local_58._M_len = 3;
  local_58._M_array = (iterator)&local_1a8;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(&local_90,&local_58);
  local_78._M_len = 3;
  local_78._M_array = this_00;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)&local_120,&local_78);
  lVar9 = 0x48;
  do {
    pvVar1 = *(void **)((long)local_d8 + lVar9);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_d8 + lVar9 + 0x10) - (long)pvVar1);
    }
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != 0);
  local_188._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4024000000000000
  ;
  uStack_180 = 0x4034000000000000;
  local_178 = 0x403e000000000000;
  local_38._M_len = 3;
  local_38._M_array = (iterator)&local_188;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense((Vector_Dense<double,_3UL> *)local_168,&local_38);
  local_1a8.data_ = (AssertHelperData *)0x4044000000000000;
  uStack_1a0 = 0x4049000000000000;
  local_198 = 0x404e000000000000;
  local_48._M_len = 3;
  local_48._M_array = (iterator)&local_1a8;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense(&local_150,&local_48);
  local_78._M_array = (iterator)0x4051800000000000;
  local_78._M_len = 0x4054000000000000;
  local_68 = 0x4056800000000000;
  local_58._M_len = 3;
  local_58._M_array = (iterator)&local_78;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense(&local_138,&local_58);
  puVar5 = (undefined8 *)local_168;
  pVVar7 = this_00;
  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pVVar7->super_vector<double,_std::allocator<double>_>).
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)*puVar5;
    puVar5 = puVar5 + (ulong)bVar10 * -2 + 1;
    pVVar7 = (Vector_Dense<double,_0UL> *)((long)pVVar7 + ((ulong)bVar10 * -2 + 1) * 8);
  }
  lVar9 = 0;
  do {
    lVar4 = 0;
    do {
      *(double *)
       ((long)&(this_00->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar4) =
           *(double *)
            ((long)&(this_00->super_vector<double,_std::allocator<double>_>).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar4) / -10.0;
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x18);
    lVar9 = lVar9 + 0x18;
    this_00 = this_00 + 1;
  } while (lVar9 != 0x48);
  local_d8[2] = local_c0.super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"-1.0 * dynamic_matrix[0][0]","static_matrix[0][0]",
             -*((local_120.
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,
             (double)local_c0.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x95,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
  }
  local_d8[1] = local_c0.super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"-1.0 * dynamic_matrix[0][1]","static_matrix[0][1]",
             -((local_120.
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[1],
             (double)local_c0.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x96,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
  }
  local_d8[0] = local_c0.super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"-1.0 * dynamic_matrix[0][2]","static_matrix[0][2]",
             -((local_120.
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[2],
             (double)local_c0.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x97,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
  }
  local_e0 = local_a8.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"-1.0 * dynamic_matrix[1][0]","static_matrix[1][0]",
             -*local_120.
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,
             (double)local_a8.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x98,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
  }
  local_e8 = local_a8.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"-1.0 * dynamic_matrix[1][1]","static_matrix[1][1]",
             -local_120.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[1],
             (double)local_a8.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x99,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
  }
  local_f0 = local_a8.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"-1.0 * dynamic_matrix[1][2]","static_matrix[1][2]",
             -local_120.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[2],
             (double)local_a8.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x9a,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
  }
  local_f8 = local_90.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"-1.0 * dynamic_matrix[2][0]","static_matrix[2][0]",
             -*local_120.
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2].
               super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,
             (double)local_90.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x9b,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
  }
  local_100 = local_90.super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"-1.0 * dynamic_matrix[2][1]","static_matrix[2][1]",
             -local_120.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[1],
             (double)local_90.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x9c,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
  }
  local_108 = local_90.super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"-1.0 * dynamic_matrix[2][2]","static_matrix[2][2]",
             -local_120.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[2],
             (double)local_90.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x9d,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  pVVar3 = local_120.
           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
    pVVar3 = local_120.
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  for (; pVVar3 != local_120.
                   super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pVVar3 = pVVar3 + 1) {
    pdVar2 = (pVVar3->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    for (pdVar6 = (pVVar3->super_vector<double,_std::allocator<double>_>).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar6 != pdVar2; pdVar6 = pdVar6 + 1) {
      *pdVar6 = *pdVar6 / 0.1;
    }
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"dynamic_matrix[0][0]","-10.0 * static_matrix[0][0]",
             **(double **)
               local_120.
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(double)local_d8[2] * -10.0);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa0,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"dynamic_matrix[0][1]","-10.0 * static_matrix[0][1]",
             ((local_120.
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],(double)local_d8[1] * -10.0);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa1,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"dynamic_matrix[0][2]","-10.0 * static_matrix[0][2]",
             ((local_120.
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2],(double)local_d8[0] * -10.0);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa2,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"dynamic_matrix[1][0]","-10.0 * static_matrix[1][0]",
             *local_120.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,(double)local_e0 * -10.0);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa3,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"dynamic_matrix[1][1]","-10.0 * static_matrix[1][1]",
             local_120.
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],(double)local_e8 * -10.0);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa4,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"dynamic_matrix[1][2]","-10.0 * static_matrix[1][2]",
             local_120.
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2],(double)local_f0 * -10.0);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa5,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"dynamic_matrix[2][0]","-10.0 * static_matrix[2][0]",
             *local_120.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,(double)local_f8 * -10.0);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa6,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"dynamic_matrix[2][1]","-10.0 * static_matrix[2][1]",
             local_120.
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].
             super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],(double)local_100 * -10.0);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa7,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"dynamic_matrix[2][2]","-10.0 * static_matrix[2][2]",
             local_120.
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].
             super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2],(double)local_108 * -10.0);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (pbStack_160 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (pbStack_160->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0xa8,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if (pbStack_160 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_160,pbStack_160);
  }
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&local_120);
  return;
}

Assistant:

TEST(test_matrix_dense, scalar_matrix_division_assignment) {
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix = {{1, 2, 3}, {4, 5, 6}, {7, 8, 9}};
  Matrix_Dense<Scalar, 3, 3> static_matrix = {{10, 20, 30}, {40, 50, 60}, {70, 80, 90}};

  static_matrix /= -10.0;
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[0][0], static_matrix[0][0]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[0][1], static_matrix[0][1]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[0][2], static_matrix[0][2]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[1][0], static_matrix[1][0]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[1][1], static_matrix[1][1]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[1][2], static_matrix[1][2]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[2][0], static_matrix[2][0]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[2][1], static_matrix[2][1]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[2][2], static_matrix[2][2]);

  dynamic_matrix /= 0.1;
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][0], -10.0 * static_matrix[0][0]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][1], -10.0 * static_matrix[0][1]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][2], -10.0 * static_matrix[0][2]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][0], -10.0 * static_matrix[1][0]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][1], -10.0 * static_matrix[1][1]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][2], -10.0 * static_matrix[1][2]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[2][0], -10.0 * static_matrix[2][0]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[2][1], -10.0 * static_matrix[2][1]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[2][2], -10.0 * static_matrix[2][2]);
}